

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLogger.cpp
# Opt level: O3

void __thiscall Js::MemoryLogger::MemoryLogger(MemoryLogger *this,TAllocator *alloc,ULONG count)

{
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  char16 **__s;
  ulong uVar5;
  size_t requestedBytes;
  
  (this->super_ILogger)._vptr_ILogger = (_func_int **)&PTR_Write_014d9578;
  this->m_current = 0;
  this->m_capacity = count;
  this->m_alloc = alloc;
  (this->m_criticalSection).super_CCLock.mutexPtr[0] = '\0';
  (this->m_criticalSection).super_CCLock.mutexPtr[1] = '\0';
  (this->m_criticalSection).super_CCLock.mutexPtr[2] = '\0';
  (this->m_criticalSection).super_CCLock.mutexPtr[3] = '\0';
  (this->m_criticalSection).super_CCLock.mutexPtr[4] = '\0';
  (this->m_criticalSection).super_CCLock.mutexPtr[5] = '\0';
  (this->m_criticalSection).super_CCLock.mutexPtr[6] = '\0';
  (this->m_criticalSection).super_CCLock.mutexPtr[7] = '\0';
  CCLock::Reset(&(this->m_criticalSection).super_CCLock,true);
  uVar5 = (ulong)this->m_capacity;
  if (uVar5 == 0) {
    __s = (char16 **)&DAT_00000008;
  }
  else {
    this_00 = &this->m_alloc->
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                  "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_006f26d3;
      *puVar4 = 0;
    }
    requestedBytes = uVar5 * 8;
    __s = (char16 **)
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::AllocInternal
                    (this_00,requestedBytes);
    memset(__s,0,requestedBytes);
    memset(__s + uVar5,0,(requestedBytes + 0xf & 0xfffffffffffffff0) + uVar5 * -8);
    if (__s == (char16 **)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                  ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_006f26d3:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
      __s = (char16 **)0x0;
    }
  }
  this->m_log = __s;
  return;
}

Assistant:

MemoryLogger::MemoryLogger(TAllocator* alloc, ULONG count) : m_alloc(alloc), m_capacity(count), m_current(0)
    {
        m_log = AnewArrayZ(m_alloc, char16*, m_capacity);
    }